

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugins.cpp
# Opt level: O2

void __thiscall f8n::plugin::Plugins::~Plugins(Plugins *this)

{
  __shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<f8n::plugin::Plugins::Descriptor> plugin;
  __shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  p_Var1 = &((this->plugins).
             super__Vector_base<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var2 = &((this->plugins).
                  super__Vector_base<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 != p_Var1; p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,p_Var2);
    (*(code *)**(undefined8 **)(local_38._M_ptr)->plugin)();
    dlclose((local_38._M_ptr)->nativeHandle);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  std::
  vector<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>
  ::clear(&this->plugins);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->prefs).super___shared_ptr<f8n::sdk::IPreferences,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>
  ::~vector(&this->plugins);
  return;
}

Assistant:

Plugins::~Plugins() {
    for (std::shared_ptr<Descriptor> plugin : this->plugins) {
        plugin->plugin->Release();
        closeNativeHandle(plugin->nativeHandle);
    }
    plugins.clear();
}